

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateManager.cpp
# Opt level: O3

Input * __thiscall helics::ValueFederateManager::getInput(ValueFederateManager *this,int index)

{
  undefined1 *puVar1;
  shared_handle inpHandle;
  shared_handle local_28;
  
  gmlc::libguarded::
  shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
  ::lock_shared(&local_28,&this->inputs);
  puVar1 = invalidIpt;
  if ((-1 < index) && (index < (int)((local_28.data)->dataStorage).csize)) {
    puVar1 = (undefined1 *)
             (((local_28.data)->dataStorage).dataptr[(uint)index >> 5] + (index & 0x1f));
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_28.m_handle_lock);
  return (Input *)puVar1;
}

Assistant:

const Input& ValueFederateManager::getInput(int index) const
{
    auto inpHandle = inputs.lock_shared();
    if (isValidIndex(index, *inpHandle)) {
        return (*inpHandle)[index];
    }
    return invalidIpt;
}